

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O0

void __thiscall
gvr::ColoredPointCloud::savePLY(ColoredPointCloud *this,char *name,bool all,ply_encoding enc)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int in_ECX;
  size_t __n;
  byte in_DL;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  int iVar5;
  char *in_RSI;
  string *psVar6;
  ColoredPointCloud *in_RDI;
  int i;
  PLYWriter ply;
  undefined4 in_stack_fffffffffffffad0;
  float in_stack_fffffffffffffad4;
  long in_stack_fffffffffffffb10;
  allocator *paVar7;
  string *in_stack_fffffffffffffb18;
  PLYWriter *in_stack_fffffffffffffb20;
  int local_478;
  allocator local_471;
  string local_470 [4];
  ply_type in_stack_fffffffffffffb94;
  string *in_stack_fffffffffffffb98;
  PLYWriter *in_stack_fffffffffffffba0;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [264];
  PLYWriter *in_stack_fffffffffffffe78;
  Model *in_stack_fffffffffffffe80;
  
  bVar1 = in_DL & 1;
  PLYWriter::PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  PLYWriter::open((PLYWriter *)(local_290 + 0x30),in_RSI,in_ECX);
  Model::setOriginToPLY(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"vertex",&local_291);
  PointCloud::getVertexCount(&in_RDI->super_PointCloud);
  PLYWriter::addElement
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"x",&local_2b9);
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"y",&local_2e1);
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"z",&local_309);
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"scan_size",&local_331);
    PLYWriter::addProperty
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    if (bVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"scan_error",&local_359);
      PLYWriter::addProperty
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"scan_conf",&local_381);
      PLYWriter::addProperty
                (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
    }
  }
  if ((bVar1 != 0) && (bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud), bVar2)) {
    paVar7 = &local_3a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"sx",paVar7);
    PLYWriter::addProperty
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
    std::__cxx11::string::~string(local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    paVar7 = &local_3d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3d0,"sy",paVar7);
    PLYWriter::addProperty
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    paVar7 = &local_3f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"sz",paVar7);
    PLYWriter::addProperty
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"diffuse_red",&local_421);
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"diffuse_green",&local_449);
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"diffuse_blue",&local_471);
  psVar6 = local_470;
  PLYWriter::addProperty
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  local_478 = 0;
  while( true ) {
    iVar5 = (int)psVar6;
    uVar4 = PointCloud::getVertexCount(&in_RDI->super_PointCloud);
    __n = (size_t)uVar4;
    if ((int)uVar4 <= local_478) break;
    iVar5 = local_478;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_478,0);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf,__n);
    iVar5 = local_478;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_478,1);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_00,__n);
    iVar5 = local_478;
    PointCloud::getVertexComp(&in_RDI->super_PointCloud,local_478,2);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_01,__n);
    bVar2 = PointCloud::hasScanProp(&in_RDI->super_PointCloud);
    if (bVar2) {
      iVar5 = local_478;
      PointCloud::getScanSize(&in_RDI->super_PointCloud,local_478);
      PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_02,__n);
      if (bVar1 != 0) {
        iVar5 = local_478;
        PointCloud::getScanError(&in_RDI->super_PointCloud,local_478);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_03,__n);
        iVar5 = local_478;
        in_stack_fffffffffffffad4 = PointCloud::getScanConf(&in_RDI->super_PointCloud,local_478);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_04,__n);
      }
    }
    if (bVar1 != 0) {
      bVar2 = PointCloud::hasScanPos(&in_RDI->super_PointCloud);
      in_stack_fffffffffffffad0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffad0);
      if (bVar2) {
        iVar5 = local_478;
        PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_478,0);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_05,__n);
        iVar5 = local_478;
        PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_478,1);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_06,__n);
        iVar5 = local_478;
        PointCloud::getScanPosComp(&in_RDI->super_PointCloud,local_478,2);
        PLYWriter::write((PLYWriter *)(local_290 + 0x30),iVar5,__buf_07,__n);
      }
    }
    bVar3 = getColorComp(in_RDI,local_478,0);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),(uint)bVar3,__buf_08,__n);
    bVar3 = getColorComp(in_RDI,local_478,1);
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),(uint)bVar3,__buf_09,__n);
    bVar3 = getColorComp(in_RDI,local_478,2);
    psVar6 = (string *)(ulong)bVar3;
    PLYWriter::write((PLYWriter *)(local_290 + 0x30),(uint)bVar3,__buf_10,__n);
    local_478 = local_478 + 1;
  }
  PLYWriter::close((PLYWriter *)(local_290 + 0x30),iVar5);
  PLYWriter::~PLYWriter((PLYWriter *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  return;
}

Assistant:

void ColoredPointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define header

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  ply.close();
}